

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O0

Hop_Obj_t * Abc_ConvertSopToAigInternal(Hop_Man_t *pMan,char *pSop)

{
  int iVar1;
  int iVar2;
  Hop_Obj_t *pHVar3;
  bool bVar4;
  char *local_40;
  char *pCube;
  int local_30;
  int nFanins;
  int Value;
  int i;
  Hop_Obj_t *pSum;
  Hop_Obj_t *pAnd;
  char *pSop_local;
  Hop_Man_t *pMan_local;
  
  iVar1 = Abc_SopGetVarNum(pSop);
  iVar2 = Abc_SopIsExorType(pSop);
  if (iVar2 == 0) {
    _Value = Hop_ManConst0(pMan);
    for (local_40 = pSop; *local_40 != '\0'; local_40 = local_40 + (iVar1 + 3)) {
      pSum = Hop_ManConst1(pMan);
      nFanins = 0;
      while( true ) {
        bVar4 = false;
        if (local_40[nFanins] != ' ') {
          local_30 = (int)local_40[nFanins];
          bVar4 = local_30 != 0;
        }
        if (!bVar4) break;
        if (local_30 == 0x31) {
          pHVar3 = Hop_IthVar(pMan,nFanins);
          pSum = Hop_And(pMan,pSum,pHVar3);
        }
        else if (local_30 == 0x30) {
          pHVar3 = Hop_IthVar(pMan,nFanins);
          pHVar3 = Hop_Not(pHVar3);
          pSum = Hop_And(pMan,pSum,pHVar3);
        }
        nFanins = nFanins + 1;
      }
      _Value = Hop_Or(pMan,_Value,pSum);
    }
  }
  else {
    _Value = Hop_ManConst0(pMan);
    for (nFanins = 0; nFanins < iVar1; nFanins = nFanins + 1) {
      pHVar3 = Hop_IthVar(pMan,nFanins);
      _Value = Hop_Exor(pMan,_Value,pHVar3);
    }
  }
  iVar1 = Abc_SopIsComplement(pSop);
  if (iVar1 != 0) {
    _Value = Hop_Not(_Value);
  }
  return _Value;
}

Assistant:

Hop_Obj_t * Abc_ConvertSopToAigInternal( Hop_Man_t * pMan, char * pSop )
{
    Hop_Obj_t * pAnd, * pSum;
    int i, Value, nFanins;
    char * pCube;
    // get the number of variables
    nFanins = Abc_SopGetVarNum(pSop);
    if ( Abc_SopIsExorType(pSop) )
    {
        pSum = Hop_ManConst0(pMan); 
        for ( i = 0; i < nFanins; i++ )
            pSum = Hop_Exor( pMan, pSum, Hop_IthVar(pMan,i) );
    }
    else
    {
        // go through the cubes of the node's SOP
        pSum = Hop_ManConst0(pMan); 
        Abc_SopForEachCube( pSop, nFanins, pCube )
        {
            // create the AND of literals
            pAnd = Hop_ManConst1(pMan);
            Abc_CubeForEachVar( pCube, Value, i )
            {
                if ( Value == '1' )
                    pAnd = Hop_And( pMan, pAnd, Hop_IthVar(pMan,i) );
                else if ( Value == '0' )
                    pAnd = Hop_And( pMan, pAnd, Hop_Not(Hop_IthVar(pMan,i)) );
            }
            // add to the sum of cubes
            pSum = Hop_Or( pMan, pSum, pAnd );
        }
    }
    // decide whether to complement the result
    if ( Abc_SopIsComplement(pSop) )
        pSum = Hop_Not(pSum);
    return pSum;
}